

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O3

ShaderExecutor *
vkt::shaderexecutor::createExecutor
          (Context *context,ShaderType shaderType,ShaderSpec *shaderSpec,
          VkDescriptorSetLayout extraResourcesLayout)

{
  FragmentOutExecutor *pFVar1;
  undefined **ppuVar2;
  VkPhysicalDeviceFeatures *pVVar3;
  NotSupportedError *this;
  BufferIoExecutor *this_00;
  InternalError *this_01;
  
  switch(shaderType) {
  case SHADERTYPE_VERTEX:
    pFVar1 = (FragmentOutExecutor *)operator_new(0x138);
    anon_unknown_0::FragmentOutExecutor::FragmentOutExecutor
              (pFVar1,context,SHADERTYPE_VERTEX,shaderSpec,extraResourcesLayout);
    ppuVar2 = &PTR__FragmentOutExecutor_00d398a8;
    break;
  case SHADERTYPE_FRAGMENT:
    pFVar1 = (FragmentOutExecutor *)operator_new(0x138);
    anon_unknown_0::FragmentOutExecutor::FragmentOutExecutor
              (pFVar1,context,SHADERTYPE_FRAGMENT,shaderSpec,extraResourcesLayout);
    ppuVar2 = &PTR__FragmentOutExecutor_00d39a80;
    break;
  case SHADERTYPE_GEOMETRY:
    pFVar1 = (FragmentOutExecutor *)operator_new(0x138);
    anon_unknown_0::FragmentOutExecutor::FragmentOutExecutor
              (pFVar1,context,SHADERTYPE_GEOMETRY,shaderSpec,extraResourcesLayout);
    (pFVar1->super_ShaderExecutor)._vptr_ShaderExecutor =
         (_func_int **)&PTR__FragmentOutExecutor_00d39a38;
    pVVar3 = Context::getDeviceFeatures(context);
    if (pVVar3->geometryShader != 0) {
      return &pFVar1->super_ShaderExecutor;
    }
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"Geometry shader type not supported by device",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
               ,0x5a9);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  case SHADERTYPE_TESSELLATION_CONTROL:
    pFVar1 = (FragmentOutExecutor *)operator_new(0x118);
    anon_unknown_0::TessellationExecutor::TessellationExecutor
              ((TessellationExecutor *)pFVar1,context,shaderSpec,extraResourcesLayout);
    ppuVar2 = &PTR__BufferIoExecutor_00d39938;
    break;
  case SHADERTYPE_TESSELLATION_EVALUATION:
    pFVar1 = (FragmentOutExecutor *)operator_new(0x118);
    anon_unknown_0::TessellationExecutor::TessellationExecutor
              ((TessellationExecutor *)pFVar1,context,shaderSpec,extraResourcesLayout);
    ppuVar2 = &PTR__BufferIoExecutor_00d399f8;
    break;
  case SHADERTYPE_COMPUTE:
    this_00 = (BufferIoExecutor *)operator_new(0x118);
    anon_unknown_0::BufferIoExecutor::BufferIoExecutor(this_00,context,shaderSpec);
    (this_00->super_ShaderExecutor)._vptr_ShaderExecutor =
         (_func_int **)&PTR__BufferIoExecutor_00d39ac8;
    *(deUint64 *)(this_00 + 1) = extraResourcesLayout.m_internal;
    return &this_00->super_ShaderExecutor;
  default:
    this_01 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_01,"Unsupported shader type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
               ,0xb3a);
    __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  (pFVar1->super_ShaderExecutor)._vptr_ShaderExecutor = (_func_int **)ppuVar2;
  return &pFVar1->super_ShaderExecutor;
}

Assistant:

ShaderExecutor* createExecutor (Context& context, glu::ShaderType shaderType, const ShaderSpec& shaderSpec, VkDescriptorSetLayout extraResourcesLayout)
{
	switch (shaderType)
	{
		case glu::SHADERTYPE_VERTEX:					return new VertexShaderExecutor		(context, shaderSpec, extraResourcesLayout);
		case glu::SHADERTYPE_TESSELLATION_CONTROL:		return new TessControlExecutor		(context, shaderSpec, extraResourcesLayout);
		case glu::SHADERTYPE_TESSELLATION_EVALUATION:	return new TessEvaluationExecutor	(context, shaderSpec, extraResourcesLayout);
		case glu::SHADERTYPE_GEOMETRY:					return new GeometryShaderExecutor	(context, shaderSpec, extraResourcesLayout);
		case glu::SHADERTYPE_FRAGMENT:					return new FragmentShaderExecutor	(context, shaderSpec, extraResourcesLayout);
		case glu::SHADERTYPE_COMPUTE:					return new ComputeShaderExecutor	(context, shaderSpec, extraResourcesLayout);
		default:
			TCU_THROW(InternalError, "Unsupported shader type");
	}
}